

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

char * bstr2cstr(const_bstring b,char z)

{
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  long lVar4;
  uchar uVar5;
  long lVar6;
  
  if (b == (const_bstring)0x0) {
    return (char *)0x0;
  }
  iVar1 = b->slen;
  lVar6 = (long)iVar1;
  if (((-1 < lVar6) && (puVar2 = b->data, puVar2 != (uchar *)0x0)) &&
     (pcVar3 = (char *)malloc(lVar6 + 1), pcVar3 != (char *)0x0)) {
    if (iVar1 != 0) {
      lVar4 = 0;
      do {
        uVar5 = puVar2[lVar4];
        if (uVar5 == '\0') {
          uVar5 = z;
        }
        pcVar3[lVar4] = uVar5;
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
    pcVar3[lVar6] = '\0';
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

char * bstr2cstr (const_bstring b, char z) {
int i, l;
char * r;

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;
	l = b->slen;
	r = (char *) bstr__alloc ((size_t)l + 1);
	if (r == NULL) return r;

	for (i=0; i < l; i ++) {
		r[i] = (char) ((b->data[i] == '\0') ? z : (char) (b->data[i]));
	}

	r[l] = (unsigned char) '\0';

	return r;
}